

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

Graph * Omega_h::invert_map_by_sorting(Graph *__return_storage_ptr__,LOs *a2b,LO nb)

{
  Read<int> local_e0;
  Read<int> local_d0;
  Read<int> *local_c0;
  LOs *ba2a;
  Read<int> local_a8;
  undefined1 local_98 [8];
  LOs b2ba;
  Read<int> local_78;
  undefined1 local_68 [8];
  Write<int> ba2b;
  Read<int> local_48;
  undefined1 local_38 [8];
  LOs ba2ab;
  LOs *ab2b;
  LO nb_local;
  LOs *a2b_local;
  
  ba2ab.write_.shared_alloc_.direct_ptr = a2b;
  Read<int>::Read(&local_48,a2b);
  sort_by_keys<int>((Omega_h *)local_38,&local_48,1);
  Read<int>::~Read(&local_48);
  Read<int>::Read(&local_78,(Read<int> *)local_38);
  Read<int>::Read((Read<int> *)&b2ba.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)ba2ab.write_.shared_alloc_.direct_ptr);
  unmap<int>((Omega_h *)local_68,&local_78,(Read<int> *)&b2ba.write_.shared_alloc_.direct_ptr,1);
  Read<int>::~Read((Read<int> *)&b2ba.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_78);
  Write<int>::Write((Write<int> *)&ba2a,(Write<int> *)local_68);
  Read<int>::Read(&local_a8,(Write<int> *)&ba2a);
  invert_funnel((Omega_h *)local_98,&local_a8,nb);
  Read<int>::~Read(&local_a8);
  Write<int>::~Write((Write<int> *)&ba2a);
  local_c0 = (Read<int> *)local_38;
  Read<int>::Read(&local_d0,(Read<int> *)local_98);
  Read<int>::Read(&local_e0,local_c0);
  Graph::Graph(__return_storage_ptr__,&local_d0,&local_e0);
  Read<int>::~Read(&local_e0);
  Read<int>::~Read(&local_d0);
  Read<int>::~Read((Read<int> *)local_98);
  Write<int>::~Write((Write<int> *)local_68);
  Read<int>::~Read((Read<int> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Graph invert_map_by_sorting(LOs a2b, LO nb) {
  auto& ab2b = a2b;
  auto ba2ab = sort_by_keys(ab2b);
  auto ba2b = unmap(ba2ab, ab2b, 1);
  auto b2ba = invert_funnel(ba2b, nb);
  auto& ba2a = ba2ab;
  return Graph(b2ba, ba2a);
}